

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O1

bool __thiscall MipsElfFile::load(MipsElfFile *this,path *fileName,path *outputFileName)

{
  Elf32_Half EVar1;
  pointer ppEVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string local_30;
  
  ghc::filesystem::path::operator=(&this->outputFileName,outputFileName);
  bVar3 = ElfFile::load(&this->elf,fileName,true);
  if (bVar3) {
    EVar1 = (this->elf).fileHeader.e_type;
    if (EVar1 == 2) {
      ppEVar2 = (this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->elf).segments.super__Vector_base<ElfSegment_*,_std::allocator<ElfSegment_*>_>.
          _M_impl.super__Vector_impl_data._M_finish != ppEVar2) {
        (*(this->super_AssemblerFile)._vptr_AssemblerFile[9])
                  (this,(ulong)((*ppEVar2)->header).p_vaddr);
        return true;
      }
      return true;
    }
    if (EVar1 != 0xffa0) {
      local_30._M_dataplus._M_p._0_2_ = EVar1;
      Logger::printError<ghc::filesystem::path,unsigned_short>
                (FatalError,"Unknown ELF %s type %d",fileName,(unsigned_short *)&local_30);
      return false;
    }
    ghc::filesystem::path::u8string_abi_cxx11_(&local_30,fileName);
    Logger::printError<std::__cxx11::string>((Logger *)0x2,0x1931f8,(char *)&local_30,in_RCX);
  }
  else {
    ghc::filesystem::path::u8string_abi_cxx11_(&local_30,fileName);
    Logger::printError<std::__cxx11::string>((Logger *)0x2,0x1931e6,(char *)&local_30,in_RCX);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT62(local_30._M_dataplus._M_p._2_6_,(Elf32_Half)local_30._M_dataplus._M_p) !=
      &local_30.field_2) {
    operator_delete((undefined1 *)
                    CONCAT62(local_30._M_dataplus._M_p._2_6_,(Elf32_Half)local_30._M_dataplus._M_p),
                    local_30.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool MipsElfFile::load(const fs::path& fileName, const fs::path& outputFileName)
{
	this->outputFileName = outputFileName;

	if (!elf.load(fileName,true))
	{
		Logger::printError(Logger::FatalError, "Failed to load %s",fileName.u8string());
		return false;
	}

	if (elf.getType() == 0xFFA0)
	{
		Logger::printError(Logger::FatalError, "Relocatable ELF %s not supported yet",fileName.u8string());
		return false;
	}

	if (elf.getType() != 2)
	{
		Logger::printError(Logger::FatalError, "Unknown ELF %s type %d",fileName,elf.getType());
		return false;
	}

	if (elf.getSegmentCount() != 0)
		seekVirtual(elf.getSegment(0)->getVirtualAddress());

	return true;
}